

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintSExpression::maybePrintImplicitBlock(PrintSExpression *this,Expression *curr)

{
  uintptr_t uVar1;
  ulong uVar2;
  Expression *pEVar3;
  
  pEVar3 = (Expression *)0x0;
  if (curr->_id == BlockId) {
    pEVar3 = curr;
  }
  if (((pEVar3 != (Expression *)0x0) && (this->full == false)) && (pEVar3[1].type.id == 0)) {
    uVar1 = pEVar3[2].type.id;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (pEVar3[2].type.id <= uVar2) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        printFullLine(this,*(Expression **)(*(long *)(pEVar3 + 2) + uVar2 * 8));
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    return;
  }
  printFullLine(this,curr);
  return;
}

Assistant:

void PrintSExpression::maybePrintImplicitBlock(Expression* curr) {
  auto block = curr->dynCast<Block>();
  if (!full && block && block->name.isNull()) {
    for (auto expression : block->list) {
      printFullLine(expression);
    }
  } else {
    printFullLine(curr);
  }
}